

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
TasGrid::OneDimensionalNodes::getFejer2Nodes
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,int level)

{
  size_type __n;
  reference pvVar1;
  double dVar2;
  int local_48;
  int local_44;
  int i;
  int l;
  int count;
  allocator<double> local_29;
  value_type_conflict2 local_28;
  undefined1 local_19;
  int local_18;
  int local_14;
  int n;
  int level_local;
  vector<double,_std::allocator<double>_> *nodes;
  
  local_14 = level;
  _n = __return_storage_ptr__;
  local_18 = OneDimensionalMeta::getNumPoints(level,rule_fejer2);
  local_19 = 0;
  __n = (size_type)local_18;
  local_28 = 0.0;
  ::std::allocator<double>::allocator(&local_29);
  ::std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,&local_28,&local_29);
  ::std::allocator<double>::~allocator(&local_29);
  if (0 < local_14) {
    i = 1;
    for (local_44 = 2; local_44 <= local_14 + 1; local_44 = local_44 + 1) {
      local_18 = OneDimensionalMeta::getNumPoints(local_44,rule_clenshawcurtis);
      for (local_48 = 1; local_48 < local_18; local_48 = local_48 + 2) {
        dVar2 = cos(((double)((local_18 - local_48) + -1) * 3.141592653589793) /
                    (double)(local_18 + -1));
        pvVar1 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           (__return_storage_ptr__,(long)i);
        *pvVar1 = dVar2;
        i = i + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> OneDimensionalNodes::getFejer2Nodes(int level){
    int n = OneDimensionalMeta::getNumPoints(level, rule_fejer2);
    std::vector<double> nodes(n, 0.0);
    if (level > 0){
        int count = 1;
        for(int l=2; l<=level+1; l++){
            n = OneDimensionalMeta::getNumPoints(l, rule_clenshawcurtis);
            for(int i=1; i<n; i+=2){
                nodes[count++] = std::cos(Maths::pi * ((double) (n-i-1)) / ((double) (n - 1)));
            }
        }
    }
    return nodes;
}